

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_field_constructors
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  undefined1 *puVar1;
  int iVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  pointer pptVar5;
  string field_name;
  string local_50 [32];
  
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"class << self");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::string(local_50,(string *)&(*pptVar5)->name_);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"def ");
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4,"(val)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"  ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
    poVar4 = std::operator<<(poVar4,".new(:");
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4,", val)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar3 = t_rb_ofstream::indent(out);
    poVar4 = std::operator<<((ostream *)ptVar3,"end");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_50);
  }
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"end");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_field_constructors(t_rb_ofstream& out, t_struct* tstruct) {

  out.indent() << "class << self" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << endl;
    }
    std::string field_name = (*f_iter)->get_name();

    out.indent() << "def " << field_name << "(val)" << endl;
    out.indent() << "  " << tstruct->get_name() << ".new(:" << field_name << ", val)" << endl;
    out.indent() << "end" << endl;
  }

  out.indent_down();
  out.indent() << "end" << endl;

  out << endl;
}